

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O3

void disruptor::test::SleepingStrategy::SignalTimeoutWaitingOnCursor_invoker(void)

{
  undefined8 uVar1;
  SignalTimeoutWaitingOnCursor t;
  string local_488;
  undefined7 uStack_487;
  undefined1 local_478 [16];
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  string local_418;
  undefined7 uStack_417;
  undefined1 local_408 [96];
  ios_base local_3a8 [264];
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 local_230 [176];
  atomic<long> local_180;
  atomic<long> local_108;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [24];
  atomic<long> local_90;
  pointer local_50;
  pointer ppSStack_48;
  pointer local_40;
  atomic<bool> local_37;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_420 = "";
  memset((ostringstream *)local_230,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  local_b0 = 0;
  local_a8[0] = 0;
  local_418 = (string)0x22;
  local_b8 = local_a8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)&local_418,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_230,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_b8,&local_418);
  if ((undefined1 *)CONCAT71(uStack_417,local_418) != local_408) {
    operator_delete((undefined1 *)CONCAT71(uStack_417,local_418));
  }
  local_240 = local_b8;
  local_238 = local_b8 + local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0x108);
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
  std::ios_base::~ios_base((ios_base *)(local_230 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_230._56_8_ = -1;
  local_180.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_108.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_90.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_50 = (pointer)0x0;
  ppSStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_37._M_base._M_i = (__atomic_base<bool>)false;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_430 = "";
  memset((ostringstream *)&local_418,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  local_298 = 0;
  local_290[0] = 0;
  local_488 = (string)0x22;
  local_2a0 = local_290;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,(char *)&local_488,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a0,&local_488);
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  local_250 = local_2a0;
  local_248 = local_2a0 + local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x108);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_440 = "";
  memset((ostringstream *)&local_418,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  local_298 = 0;
  local_290[0] = 0;
  local_488 = (string)0x22;
  local_2a0 = local_290;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,(char *)&local_488,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a0,&local_488);
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  local_260 = local_2a0;
  local_258 = local_2a0 + local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_448,0x108);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  SignalTimeoutWaitingOnCursor::test_method((SignalTimeoutWaitingOnCursor *)local_230);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_450 = "";
  memset((ostringstream *)&local_418,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  local_298 = 0;
  local_290[0] = 0;
  local_488 = (string)0x22;
  local_2a0 = local_290;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,(char *)&local_488,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a0,&local_488);
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  local_270 = local_2a0;
  local_268 = local_2a0 + local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_458,0x108);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_460 = "";
  memset((ostringstream *)&local_418,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  local_298 = 0;
  local_290[0] = 0;
  local_488 = (string)0x22;
  local_2a0 = local_290;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,(char *)&local_488,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"SignalTimeoutWaitingOnCursor",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a0,&local_488);
  if ((undefined1 *)CONCAT71(uStack_487,local_488) != local_478) {
    operator_delete((undefined1 *)CONCAT71(uStack_487,local_488));
  }
  local_280 = local_2a0;
  local_278 = local_2a0 + local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_468,0x108);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}